

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  Curl_easy *data;
  _Bool _Var1;
  sa_family_t sVar2;
  CURLcode CVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  if2ip_result_t iVar7;
  undefined8 extraout_RAX;
  size_t sVar8;
  long lVar9;
  uint *puVar10;
  int *piVar11;
  CURLcode __len;
  ushort uVar12;
  char *pcVar13;
  char *fmt;
  Curl_easy *pCVar14;
  char cVar15;
  bool bVar16;
  curltime cVar17;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  int optval;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  char myhost [256];
  uint local_2d4;
  Curl_easy *local_2d0;
  char *local_2c8;
  uint local_2bc;
  uint local_2b8;
  int local_2b4;
  char *local_2b0;
  Curl_dns_entry *local_2a8;
  long local_2a0;
  undefined4 local_294;
  undefined4 local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  data = conn->data;
  local_290 = 1;
  *sockp = -1;
  CVar3 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2d4);
  if (CVar3 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var1 = Curl_getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var1) {
    puVar10 = (uint *)__errno_location();
    uVar6 = *puVar10;
    pcVar13 = Curl_strerror(conn,uVar6);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar6,pcVar13);
    Curl_closesocket(conn,local_2d4);
    return CURLE_OK;
  }
  iVar5 = 0;
  Curl_infof(data,"  Trying %s...\n",local_1f8);
  if (((local_1c8._0_4_ & 0xfffffff7) == 2) && (local_1c8._4_4_ == 1)) {
    if ((data->set).tcp_nodelay == true) {
      Curl_tcpnodelay(conn,local_2d4);
    }
    uVar6 = local_2d4;
    if ((data->set).tcp_keepalive == true) {
      local_138._0_4_ = 1;
      iVar4 = setsockopt(local_2d4,1,9,&local_138,4);
      if (iVar4 < 0) {
        pcVar13 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar4 = curlx_sltosi((data->set).tcp_keepidle);
        local_138._0_4_ = iVar4;
        iVar4 = setsockopt(uVar6,6,4,&local_138,4);
        if (iVar4 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar6);
        }
        iVar4 = curlx_sltosi((data->set).tcp_keepintvl);
        local_138._0_4_ = iVar4;
        iVar4 = setsockopt(uVar6,6,5,&local_138,4);
        if (-1 < iVar4) goto LAB_004392fe;
        pcVar13 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(data,pcVar13,(ulong)uVar6);
    }
  }
LAB_004392fe:
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
LAB_0043935a:
    local_294 = 0;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar6 = local_2d4;
    iVar5 = (*(data->set).fsockopt)((data->set).sockopt_client,local_2d4,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar5 == 0) goto LAB_0043935a;
    local_294 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if (iVar5 != 2) {
      Curl_closesocket(conn,uVar6);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  local_2b4 = iVar5;
  if ((local_1c8._0_4_ & 0xfffffff7) != 2) goto LAB_004398e6;
  local_2c8 = (char *)CONCAT44(local_2c8._4_4_,local_1c8._0_4_);
  local_2bc = local_2d4;
  uVar6 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
  pCVar14 = conn->data;
  local_2a8 = (Curl_dns_entry *)0x0;
  uVar12 = (pCVar14->set).localport;
  pcVar13 = (pCVar14->set).str[8];
  CVar3 = CURLE_OK;
  if (uVar12 != 0 || pcVar13 != (char *)0x0) {
    local_2a0 = CONCAT44(local_2a0._4_4_,uVar6);
    iVar5 = (pCVar14->set).localportrange;
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288.sa_family = 0;
    local_288.sa_data[0] = '\0';
    local_288.sa_data[1] = '\0';
    local_288.sa_data[2] = '\0';
    local_288.sa_data[3] = '\0';
    local_288.sa_data[4] = '\0';
    local_288.sa_data[5] = '\0';
    local_288.sa_data[6] = '\0';
    local_288.sa_data[7] = '\0';
    local_288.sa_data[8] = '\0';
    local_288.sa_data[9] = '\0';
    local_288.sa_data[10] = '\0';
    local_288.sa_data[0xb] = '\0';
    local_288.sa_data[0xc] = '\0';
    local_288.sa_data[0xd] = '\0';
    local_2d0 = pCVar14;
    if ((pcVar13 == (char *)0x0) || (sVar8 = strlen(pcVar13), 0xfe < sVar8)) {
      if ((CURLcode)local_2c8 == 10) {
        __len = CURLE_OPERATION_TIMEDOUT;
        sVar2 = 10;
      }
      else {
        __len = CURLE_OK;
        if ((CURLcode)local_2c8 != 2) goto LAB_004397b6;
        __len = CURLE_HTTP2;
        sVar2 = 2;
      }
      local_288.sa_data._0_2_ = uVar12 << 8 | uVar12 >> 8;
      local_288.sa_family = sVar2;
    }
    else {
      memset(&local_138,0,0x100);
      iVar4 = strncmp("if!",pcVar13,3);
      cVar15 = iVar4 == 0;
      if ((bool)cVar15) {
        bVar16 = false;
        lVar9 = 3;
      }
      else {
        iVar4 = strncmp("host!",pcVar13,5);
        bVar16 = iVar4 == 0;
        lVar9 = (ulong)bVar16 * 5;
      }
      pcVar13 = pcVar13 + lVar9;
      local_2b0 = pcVar13;
      if (bVar16) {
        CVar3 = CURLE_OK;
LAB_004394cb:
        pcVar13 = local_2b0;
        if (cVar15 == '\0') {
          local_2a0 = conn->ip_version;
          if ((CURLcode)local_2c8 == 2) {
            lVar9 = 1;
LAB_004395b2:
            conn->ip_version = lVar9;
          }
          else if ((CURLcode)local_2c8 == 10) {
            lVar9 = 2;
            goto LAB_004395b2;
          }
          Curl_resolv(conn,local_2b0,0,&local_2a8);
          conn->ip_version = local_2a0;
          if (local_2a8 == (Curl_dns_entry *)0x0) {
            CVar3 = ~CURLE_OK;
          }
          else {
            Curl_printable_address(local_2a8->addr,(char *)&local_138,0x100);
            Curl_infof(local_2d0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",pcVar13,
                       (ulong)local_2c8 & 0xffffffff,&local_138,
                       (ulong)(uint)local_2a8->addr->ai_family);
            Curl_resolv_unlock(local_2d0,local_2a8);
            CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
          }
        }
        __len = CURLE_OK;
        if (0 < (int)CVar3) {
          if ((CURLcode)local_2c8 == 2) {
            iVar4 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
            __len = CURLE_OK;
            if (0 < iVar4) {
              local_288.sa_data._0_2_ = uVar12 << 8 | uVar12 >> 8;
              local_288.sa_family = 2;
              __len = CURLE_HTTP2;
            }
          }
          else if ((CURLcode)local_2c8 == 10) {
            pcVar13 = strchr((char *)&local_138,0x25);
            if (pcVar13 == (char *)0x0) {
              local_2c8 = (char *)0x0;
            }
            else {
              local_2c8 = pcVar13 + 1;
              *pcVar13 = '\0';
            }
            iVar4 = inet_pton(10,(char *)&local_138,local_288.sa_data + 6);
            __len = CURLE_OPERATION_TIMEDOUT;
            if (0 < iVar4) {
              local_288.sa_data._0_2_ = uVar12 << 8 | uVar12 >> 8;
              local_288.sa_family = 10;
              if (local_2c8 != (char *)0x0) {
                iVar4 = atoi(local_2c8);
                __len = CURLE_OPERATION_TIMEDOUT;
                uStack_270 = CONCAT44(uStack_270._4_4_,iVar4);
              }
            }
          }
        }
        if ((int)CVar3 < 1) {
          local_2c8 = (char *)CONCAT44(local_2c8._4_4_,__len);
          (local_2d0->state).errorbuf = false;
          pcVar13 = "Couldn\'t bind to \'%s\'";
LAB_0043978a:
          Curl_failf(local_2d0,pcVar13,local_2b0);
          bVar16 = false;
          CVar3 = CURLE_INTERFACE_FAILED;
          __len = (CURLcode)local_2c8;
        }
        else {
          bVar16 = true;
        }
      }
      else {
        local_2b8 = (uint)(byte)cVar15;
        sVar8 = strlen(pcVar13);
        iVar4 = setsockopt(local_2bc,1,0x19,pcVar13,(int)sVar8 + 1);
        if (iVar4 != 0) {
          iVar7 = Curl_if2ip((CURLcode)local_2c8,(uint)local_2a0,conn->scope_id,pcVar13,
                             (char *)&local_138,0x100);
          if (iVar7 == IF2IP_FOUND) {
            Curl_infof(local_2d0,"Local Interface %s is ip %s using address family %i\n",local_2b0,
                       &local_138,(ulong)local_2c8 & 0xffffffff);
            cVar15 = '\x01';
            CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
            goto LAB_004394cb;
          }
          __len = CURLE_OK;
          if (iVar7 == IF2IP_AF_NOT_SUPPORTED) {
            bVar16 = false;
            CVar3 = CURLE_UNSUPPORTED_PROTOCOL;
            goto LAB_004397a2;
          }
          cVar15 = (char)local_2b8;
          CVar3 = __len;
          if ((iVar7 != IF2IP_NOT_FOUND) || (CVar3 = CURLE_OK, cVar15 == '\0')) goto LAB_004394cb;
          local_2c8 = (char *)((ulong)local_2c8 & 0xffffffff00000000);
          pcVar13 = "Couldn\'t bind to interface \'%s\'";
          goto LAB_0043978a;
        }
        bVar16 = false;
        __len = CURLE_OK;
        CVar3 = CURLE_OK;
      }
LAB_004397a2:
      if (!bVar16) goto LAB_004398c2;
    }
LAB_004397b6:
    while (iVar4 = bind(local_2bc,&local_288,__len), iVar4 < 0) {
      if (iVar5 < 2) {
        puVar10 = (uint *)__errno_location();
        pCVar14 = local_2d0;
        uVar6 = *puVar10;
        (local_2d0->state).os_errno = uVar6;
        pcVar13 = Curl_strerror(conn,uVar6);
        fmt = "bind failed with errno %d: %s";
        goto LAB_004398ad;
      }
      iVar5 = iVar5 + -1;
      Curl_infof(local_2d0,"Bind to local port %hu failed, trying next\n",(ulong)uVar12);
      uVar12 = uVar12 + 1;
      local_288.sa_data._0_2_ = uVar12 * 0x100 | uVar12 >> 8;
    }
    local_28c = 0x80;
    local_138.sa_family = 0;
    local_138.sa_data[0] = '\0';
    local_138.sa_data[1] = '\0';
    local_138.sa_data[2] = '\0';
    local_138.sa_data[3] = '\0';
    local_138.sa_data[4] = '\0';
    local_138.sa_data[5] = '\0';
    local_138.sa_data[6] = '\0';
    local_138.sa_data[7] = '\0';
    local_138.sa_data[8] = '\0';
    local_138.sa_data[9] = '\0';
    local_138.sa_data[10] = '\0';
    local_138.sa_data[0xb] = '\0';
    local_138.sa_data[0xc] = '\0';
    local_138.sa_data[0xd] = '\0';
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_f8 = 0;
    uStack_f0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    iVar5 = getsockname(local_2bc,&local_138,&local_28c);
    if (iVar5 < 0) {
      puVar10 = (uint *)__errno_location();
      pCVar14 = local_2d0;
      uVar6 = *puVar10;
      (local_2d0->state).os_errno = uVar6;
      pcVar13 = Curl_strerror(conn,uVar6);
      fmt = "getsockname() failed with errno %d: %s";
LAB_004398ad:
      Curl_failf(pCVar14,fmt,(ulong)uVar6,pcVar13);
      CVar3 = CURLE_INTERFACE_FAILED;
    }
    else {
      CVar3 = CURLE_OK;
      Curl_infof(local_2d0,"Local port: %hu\n",(ulong)uVar12);
      (conn->bits).bound = true;
    }
  }
LAB_004398c2:
  if (CVar3 != CURLE_OK) {
    Curl_closesocket(conn,local_2d4);
    if (CVar3 == CURLE_UNSUPPORTED_PROTOCOL) {
      return CURLE_COULDNT_CONNECT;
    }
    return CVar3;
  }
LAB_004398e6:
  curlx_nonblock(local_2d4,1);
  cVar17 = Curl_now();
  (conn->connecttime).tv_sec = cVar17.tv_sec;
  (conn->connecttime).tv_usec = cVar17.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr,EXPIRE_DNS_PER_NAME);
  }
  if (((char)local_294 == '\0') && (conn->socktype == 1)) {
    if ((conn->bits).tcp_fastopen == true) {
      iVar5 = setsockopt(local_2d4,6,0x1e,&local_290,4);
      if (iVar5 < 0) {
        Curl_infof(data,"Failed to enable TCP Fast Open on fd %d\n",(ulong)local_2d4);
      }
      else {
        Curl_infof(data,"TCP_FASTOPEN_CONNECT set\n");
      }
    }
    iVar5 = connect(local_2d4,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_);
    if (iVar5 == -1) {
      piVar11 = __errno_location();
      local_2b4 = *piVar11;
    }
    iVar4 = local_2b4;
    CVar3 = CURLE_OK;
    bVar16 = true;
    if (((iVar5 == -1) && (local_2b4 != 0xb)) && (local_2b4 != 0x73)) {
      pcVar13 = Curl_strerror(conn,local_2b4);
      Curl_infof(data,"Immediate connect fail for %s: %s\n",local_1f8,pcVar13);
      (data->state).os_errno = iVar4;
      Curl_closesocket(conn,local_2d4);
      bVar16 = false;
      CVar3 = CURLE_COULDNT_CONNECT;
    }
    if (bVar16) {
      *sockp = local_2d4;
    }
  }
  else {
    *sockp = local_2d4;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!Curl_getaddressinfo((struct sockaddr*)&addr.sa_addr,
                          ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(conn, errno));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    Curl_tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1)
    Curl_expire(data, conn->timeoutms_per_addr, EXPIRE_DNS_PER_NAME);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d\n", sockfd);
      else
        infof(data, "TCP_FASTOPEN_CONNECT set\n");

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}